

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newline_string.c
# Opt level: O0

char * mpt_newline_string(int type)

{
  char *local_18;
  char *nl;
  int type_local;
  
  local_18 = "\r\n";
  if ((type < 0) || (nl._4_4_ = type, type == 0)) {
    nl._4_4_ = mpt_newline_native();
  }
  if (nl._4_4_ == 2) {
    local_18 = "\n";
  }
  if (nl._4_4_ == 1) {
    local_18 = "\r";
  }
  return local_18;
}

Assistant:

extern const char *mpt_newline_string(int type)
{
	static const char nl_unix[] = { '\n', 0 };
	static const char nl_mac[] = { '\r', 0 };
	static const char nl_net[] = { '\r', '\n', 0 };
	const char *nl = nl_net;
	
	if (type < 0 || !type) {
		type = mpt_newline_native();
	}
	if (type == MPT_ENUM(NewlineUnix)) {
		nl = nl_unix;
	}
	if (type == MPT_ENUM(NewlineMac)) {
		nl = nl_mac;
	}
	return nl;
}